

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O0

bool caffe::UpgradeV0LayerParameter
               (V1LayerParameter *v0_layer_connection,V1LayerParameter *layer_param)

{
  bool bVar1;
  int iVar2;
  V1LayerParameter_LayerType value;
  V0LayerParameter_PoolMethod VVar3;
  uint32 uVar4;
  string *psVar5;
  V0LayerParameter *this;
  BlobProto *this_00;
  BlobProto *from;
  InnerProductParameter *pIVar6;
  FillerParameter *pFVar7;
  FillerParameter *pFVar8;
  ConvolutionParameter *pCVar9;
  PoolingParameter *pPVar10;
  DropoutParameter *this_01;
  LRNParameter *pLVar11;
  InfogainLossParameter *this_02;
  HDF5DataParameter *pHVar12;
  TransformationParameter *pTVar13;
  DataParameter *pDVar14;
  ImageDataParameter *pIVar15;
  ConcatParameter *this_03;
  WindowDataParameter *pWVar16;
  string *psVar17;
  HDF5OutputParameter *this_04;
  HDF5OutputParameter *from_00;
  ostream *poVar18;
  float fVar19;
  int local_44;
  V0LayerParameter_PoolMethod pool;
  int i_4;
  int i_3;
  int i_2;
  string *type;
  V0LayerParameter *v0_layer_param;
  int local_20;
  int i_1;
  int i;
  bool is_fully_compatible;
  V1LayerParameter *layer_param_local;
  V1LayerParameter *v0_layer_connection_local;
  
  i_1._3_1_ = true;
  V1LayerParameter::Clear(layer_param);
  for (local_20 = 0; iVar2 = V1LayerParameter::bottom_size(v0_layer_connection), local_20 < iVar2;
      local_20 = local_20 + 1) {
    psVar5 = V1LayerParameter::bottom_abi_cxx11_(v0_layer_connection,local_20);
    V1LayerParameter::add_bottom(layer_param,psVar5);
  }
  for (v0_layer_param._4_4_ = 0; iVar2 = V1LayerParameter::top_size(v0_layer_connection),
      v0_layer_param._4_4_ < iVar2; v0_layer_param._4_4_ = v0_layer_param._4_4_ + 1) {
    psVar5 = V1LayerParameter::top_abi_cxx11_(v0_layer_connection,v0_layer_param._4_4_);
    V1LayerParameter::add_top(layer_param,psVar5);
  }
  bVar1 = V1LayerParameter::has_layer(v0_layer_connection);
  if (bVar1) {
    this = V1LayerParameter::layer(v0_layer_connection);
    bVar1 = V0LayerParameter::has_name(this);
    if (bVar1) {
      psVar5 = V0LayerParameter::name_abi_cxx11_(this);
      V1LayerParameter::set_name(layer_param,psVar5);
    }
    psVar5 = V0LayerParameter::type_abi_cxx11_(this);
    bVar1 = V0LayerParameter::has_type(this);
    if (bVar1) {
      value = UpgradeV0LayerType(psVar5);
      V1LayerParameter::set_type(layer_param,value);
    }
    for (i_4 = 0; iVar2 = V0LayerParameter::blobs_size(this), i_4 < iVar2; i_4 = i_4 + 1) {
      this_00 = V1LayerParameter::add_blobs(layer_param);
      from = V0LayerParameter::blobs(this,i_4);
      BlobProto::CopyFrom(this_00,from);
    }
    for (pool = V0LayerParameter_PoolMethod_MAX; iVar2 = V0LayerParameter::blobs_lr_size(this),
        (int)pool < iVar2; pool = pool + V0LayerParameter_PoolMethod_AVE) {
      fVar19 = V0LayerParameter::blobs_lr(this,pool);
      V1LayerParameter::add_blobs_lr(layer_param,fVar19);
    }
    for (local_44 = 0; iVar2 = V0LayerParameter::weight_decay_size(this), local_44 < iVar2;
        local_44 = local_44 + 1) {
      fVar19 = V0LayerParameter::weight_decay(this,local_44);
      V1LayerParameter::add_weight_decay(layer_param,fVar19);
    }
    bVar1 = V0LayerParameter::has_num_output(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"conv");
      if (bVar1) {
        pCVar9 = V1LayerParameter::mutable_convolution_param(layer_param);
        uVar4 = V0LayerParameter::num_output(this);
        ConvolutionParameter::set_num_output(pCVar9,uVar4);
      }
      else {
        i_1._3_1_ = std::operator==(psVar5,"innerproduct");
        if (i_1._3_1_) {
          pIVar6 = V1LayerParameter::mutable_inner_product_param(layer_param);
          uVar4 = V0LayerParameter::num_output(this);
          InnerProductParameter::set_num_output(pIVar6,uVar4);
        }
        else {
          poVar18 = std::operator<<((ostream *)&std::cerr,
                                    "Unknown parameter num_output for layer type ");
          std::operator<<(poVar18,(string *)psVar5);
        }
      }
    }
    bVar1 = V0LayerParameter::has_biasterm(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"conv");
      if (bVar1) {
        pCVar9 = V1LayerParameter::mutable_convolution_param(layer_param);
        bVar1 = V0LayerParameter::biasterm(this);
        ConvolutionParameter::set_bias_term(pCVar9,bVar1);
      }
      else {
        bVar1 = std::operator==(psVar5,"innerproduct");
        if (bVar1) {
          pIVar6 = V1LayerParameter::mutable_inner_product_param(layer_param);
          bVar1 = V0LayerParameter::biasterm(this);
          InnerProductParameter::set_bias_term(pIVar6,bVar1);
        }
        else {
          poVar18 = std::operator<<((ostream *)&std::cerr,
                                    "Unknown parameter biasterm for layer type ");
          std::operator<<(poVar18,(string *)psVar5);
          i_1._3_1_ = false;
        }
      }
    }
    bVar1 = V0LayerParameter::has_weight_filler(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"conv");
      if (bVar1) {
        pCVar9 = V1LayerParameter::mutable_convolution_param(layer_param);
        pFVar7 = ConvolutionParameter::mutable_weight_filler(pCVar9);
        pFVar8 = V0LayerParameter::weight_filler(this);
        FillerParameter::CopyFrom(pFVar7,pFVar8);
      }
      else {
        bVar1 = std::operator==(psVar5,"innerproduct");
        if (bVar1) {
          pIVar6 = V1LayerParameter::mutable_inner_product_param(layer_param);
          pFVar7 = InnerProductParameter::mutable_weight_filler(pIVar6);
          pFVar8 = V0LayerParameter::weight_filler(this);
          FillerParameter::CopyFrom(pFVar7,pFVar8);
        }
        else {
          poVar18 = std::operator<<((ostream *)&std::cerr,
                                    "Unknown parameter weight_filler for layer type ");
          std::operator<<(poVar18,(string *)psVar5);
          i_1._3_1_ = false;
        }
      }
    }
    bVar1 = V0LayerParameter::has_bias_filler(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"conv");
      if (bVar1) {
        pCVar9 = V1LayerParameter::mutable_convolution_param(layer_param);
        pFVar7 = ConvolutionParameter::mutable_bias_filler(pCVar9);
        pFVar8 = V0LayerParameter::bias_filler(this);
        FillerParameter::CopyFrom(pFVar7,pFVar8);
      }
      else {
        bVar1 = std::operator==(psVar5,"innerproduct");
        if (bVar1) {
          pIVar6 = V1LayerParameter::mutable_inner_product_param(layer_param);
          pFVar7 = InnerProductParameter::mutable_bias_filler(pIVar6);
          pFVar8 = V0LayerParameter::bias_filler(this);
          FillerParameter::CopyFrom(pFVar7,pFVar8);
        }
        else {
          poVar18 = std::operator<<((ostream *)&std::cerr,
                                    "Unknown parameter bias_filler for layer type ");
          std::operator<<(poVar18,(string *)psVar5);
          i_1._3_1_ = false;
        }
      }
    }
    bVar1 = V0LayerParameter::has_pad(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"conv");
      if (bVar1) {
        pCVar9 = V1LayerParameter::mutable_convolution_param(layer_param);
        uVar4 = V0LayerParameter::pad(this);
        ConvolutionParameter::add_pad(pCVar9,uVar4);
      }
      else {
        bVar1 = std::operator==(psVar5,"pool");
        if (bVar1) {
          pPVar10 = V1LayerParameter::mutable_pooling_param(layer_param);
          uVar4 = V0LayerParameter::pad(this);
          PoolingParameter::set_pad(pPVar10,uVar4);
        }
        else {
          poVar18 = std::operator<<((ostream *)&std::cerr,"Unknown parameter pad for layer type ");
          std::operator<<(poVar18,(string *)psVar5);
          i_1._3_1_ = false;
        }
      }
    }
    bVar1 = V0LayerParameter::has_kernelsize(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"conv");
      if (bVar1) {
        pCVar9 = V1LayerParameter::mutable_convolution_param(layer_param);
        uVar4 = V0LayerParameter::kernelsize(this);
        ConvolutionParameter::add_kernel_size(pCVar9,uVar4);
      }
      else {
        bVar1 = std::operator==(psVar5,"pool");
        if (bVar1) {
          pPVar10 = V1LayerParameter::mutable_pooling_param(layer_param);
          uVar4 = V0LayerParameter::kernelsize(this);
          PoolingParameter::set_kernel_size(pPVar10,uVar4);
        }
        else {
          poVar18 = std::operator<<((ostream *)&std::cerr,
                                    "Unknown parameter kernelsize for layer type ");
          std::operator<<(poVar18,(string *)psVar5);
          i_1._3_1_ = false;
        }
      }
    }
    bVar1 = V0LayerParameter::has_group(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"conv");
      if (bVar1) {
        pCVar9 = V1LayerParameter::mutable_convolution_param(layer_param);
        uVar4 = V0LayerParameter::group(this);
        ConvolutionParameter::set_group(pCVar9,uVar4);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,"Unknown parameter group for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_stride(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"conv");
      if (bVar1) {
        pCVar9 = V1LayerParameter::mutable_convolution_param(layer_param);
        uVar4 = V0LayerParameter::stride(this);
        ConvolutionParameter::add_stride(pCVar9,uVar4);
      }
      else {
        bVar1 = std::operator==(psVar5,"pool");
        if (bVar1) {
          pPVar10 = V1LayerParameter::mutable_pooling_param(layer_param);
          uVar4 = V0LayerParameter::stride(this);
          PoolingParameter::set_stride(pPVar10,uVar4);
        }
        else {
          poVar18 = std::operator<<((ostream *)&std::cerr,"Unknown parameter stride for layer type "
                                   );
          std::operator<<(poVar18,(string *)psVar5);
          i_1._3_1_ = false;
        }
      }
    }
    bVar1 = V0LayerParameter::has_pool(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"pool");
      if (bVar1) {
        VVar3 = V0LayerParameter::pool(this);
        if (VVar3 == V0LayerParameter_PoolMethod_MAX) {
          pPVar10 = V1LayerParameter::mutable_pooling_param(layer_param);
          PoolingParameter::set_pool(pPVar10,PoolingParameter_PoolMethod_MAX);
        }
        else if (VVar3 == V0LayerParameter_PoolMethod_AVE) {
          pPVar10 = V1LayerParameter::mutable_pooling_param(layer_param);
          PoolingParameter::set_pool(pPVar10,PoolingParameter_PoolMethod_AVE);
        }
        else if (VVar3 == V0LayerParameter_PoolMethod_STOCHASTIC) {
          pPVar10 = V1LayerParameter::mutable_pooling_param(layer_param);
          PoolingParameter::set_pool(pPVar10,PoolingParameter_PoolMethod_STOCHASTIC);
        }
        else {
          poVar18 = std::operator<<((ostream *)&std::cerr,"Unknown pool method ");
          std::ostream::operator<<(poVar18,VVar3);
          i_1._3_1_ = false;
        }
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,"Unknown parameter pool for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_dropout_ratio(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"dropout");
      if (bVar1) {
        this_01 = V1LayerParameter::mutable_dropout_param(layer_param);
        fVar19 = V0LayerParameter::dropout_ratio(this);
        DropoutParameter::set_dropout_ratio(this_01,fVar19);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter dropout_ratio for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_local_size(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"lrn");
      if (bVar1) {
        pLVar11 = V1LayerParameter::mutable_lrn_param(layer_param);
        uVar4 = V0LayerParameter::local_size(this);
        LRNParameter::set_local_size(pLVar11,uVar4);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter local_size for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_alpha(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"lrn");
      if (bVar1) {
        pLVar11 = V1LayerParameter::mutable_lrn_param(layer_param);
        fVar19 = V0LayerParameter::alpha(this);
        LRNParameter::set_alpha(pLVar11,fVar19);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,"Unknown parameter alpha for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_beta(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"lrn");
      if (bVar1) {
        pLVar11 = V1LayerParameter::mutable_lrn_param(layer_param);
        fVar19 = V0LayerParameter::beta(this);
        LRNParameter::set_beta(pLVar11,fVar19);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,"Unknown parameter beta for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_k(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"lrn");
      if (bVar1) {
        pLVar11 = V1LayerParameter::mutable_lrn_param(layer_param);
        fVar19 = V0LayerParameter::k(this);
        LRNParameter::set_k(pLVar11,fVar19);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,"Unknown parameter k for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_source(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"data");
      if (bVar1) {
        pDVar14 = V1LayerParameter::mutable_data_param(layer_param);
        psVar17 = V0LayerParameter::source_abi_cxx11_(this);
        DataParameter::set_source(pDVar14,psVar17);
      }
      else {
        bVar1 = std::operator==(psVar5,"hdf5_data");
        if (bVar1) {
          pHVar12 = V1LayerParameter::mutable_hdf5_data_param(layer_param);
          psVar17 = V0LayerParameter::source_abi_cxx11_(this);
          HDF5DataParameter::set_source(pHVar12,psVar17);
        }
        else {
          bVar1 = std::operator==(psVar5,"images");
          if (bVar1) {
            pIVar15 = V1LayerParameter::mutable_image_data_param(layer_param);
            psVar17 = V0LayerParameter::source_abi_cxx11_(this);
            ImageDataParameter::set_source(pIVar15,psVar17);
          }
          else {
            bVar1 = std::operator==(psVar5,"window_data");
            if (bVar1) {
              pWVar16 = V1LayerParameter::mutable_window_data_param(layer_param);
              psVar17 = V0LayerParameter::source_abi_cxx11_(this);
              WindowDataParameter::set_source(pWVar16,psVar17);
            }
            else {
              bVar1 = std::operator==(psVar5,"infogain_loss");
              if (bVar1) {
                this_02 = V1LayerParameter::mutable_infogain_loss_param(layer_param);
                psVar17 = V0LayerParameter::source_abi_cxx11_(this);
                InfogainLossParameter::set_source(this_02,psVar17);
              }
              else {
                poVar18 = std::operator<<((ostream *)&std::cerr,
                                          "Unknown parameter source for layer type ");
                std::operator<<(poVar18,(string *)psVar5);
                i_1._3_1_ = false;
              }
            }
          }
        }
      }
    }
    bVar1 = V0LayerParameter::has_scale(this);
    if (bVar1) {
      pTVar13 = V1LayerParameter::mutable_transform_param(layer_param);
      fVar19 = V0LayerParameter::scale(this);
      TransformationParameter::set_scale(pTVar13,fVar19);
    }
    bVar1 = V0LayerParameter::has_meanfile(this);
    if (bVar1) {
      pTVar13 = V1LayerParameter::mutable_transform_param(layer_param);
      psVar17 = V0LayerParameter::meanfile_abi_cxx11_(this);
      TransformationParameter::set_mean_file(pTVar13,psVar17);
    }
    bVar1 = V0LayerParameter::has_batchsize(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"data");
      if (bVar1) {
        pDVar14 = V1LayerParameter::mutable_data_param(layer_param);
        uVar4 = V0LayerParameter::batchsize(this);
        DataParameter::set_batch_size(pDVar14,uVar4);
      }
      else {
        bVar1 = std::operator==(psVar5,"hdf5_data");
        if (bVar1) {
          pHVar12 = V1LayerParameter::mutable_hdf5_data_param(layer_param);
          uVar4 = V0LayerParameter::batchsize(this);
          HDF5DataParameter::set_batch_size(pHVar12,uVar4);
        }
        else {
          bVar1 = std::operator==(psVar5,"images");
          if (bVar1) {
            pIVar15 = V1LayerParameter::mutable_image_data_param(layer_param);
            uVar4 = V0LayerParameter::batchsize(this);
            ImageDataParameter::set_batch_size(pIVar15,uVar4);
          }
          else {
            bVar1 = std::operator==(psVar5,"window_data");
            if (bVar1) {
              pWVar16 = V1LayerParameter::mutable_window_data_param(layer_param);
              uVar4 = V0LayerParameter::batchsize(this);
              WindowDataParameter::set_batch_size(pWVar16,uVar4);
            }
            else {
              poVar18 = std::operator<<((ostream *)&std::cerr,
                                        "Unknown parameter batchsize for layer type ");
              std::operator<<(poVar18,(string *)psVar5);
              i_1._3_1_ = false;
            }
          }
        }
      }
    }
    bVar1 = V0LayerParameter::has_cropsize(this);
    if (bVar1) {
      pTVar13 = V1LayerParameter::mutable_transform_param(layer_param);
      uVar4 = V0LayerParameter::cropsize(this);
      TransformationParameter::set_crop_size(pTVar13,uVar4);
    }
    bVar1 = V0LayerParameter::has_mirror(this);
    if (bVar1) {
      pTVar13 = V1LayerParameter::mutable_transform_param(layer_param);
      bVar1 = V0LayerParameter::mirror(this);
      TransformationParameter::set_mirror(pTVar13,bVar1);
    }
    bVar1 = V0LayerParameter::has_rand_skip(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"data");
      if (bVar1) {
        pDVar14 = V1LayerParameter::mutable_data_param(layer_param);
        uVar4 = V0LayerParameter::rand_skip(this);
        DataParameter::set_rand_skip(pDVar14,uVar4);
      }
      else {
        bVar1 = std::operator==(psVar5,"images");
        if (bVar1) {
          pIVar15 = V1LayerParameter::mutable_image_data_param(layer_param);
          uVar4 = V0LayerParameter::rand_skip(this);
          ImageDataParameter::set_rand_skip(pIVar15,uVar4);
        }
        else {
          poVar18 = std::operator<<((ostream *)&std::cerr,
                                    "Unknown parameter rand_skip for layer type ");
          std::operator<<(poVar18,(string *)psVar5);
          i_1._3_1_ = false;
        }
      }
    }
    bVar1 = V0LayerParameter::has_shuffle_images(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"images");
      if (bVar1) {
        pIVar15 = V1LayerParameter::mutable_image_data_param(layer_param);
        bVar1 = V0LayerParameter::shuffle_images(this);
        ImageDataParameter::set_shuffle(pIVar15,bVar1);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,"Unknown parameter shuffle for layer type ")
        ;
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_new_height(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"images");
      if (bVar1) {
        pIVar15 = V1LayerParameter::mutable_image_data_param(layer_param);
        uVar4 = V0LayerParameter::new_height(this);
        ImageDataParameter::set_new_height(pIVar15,uVar4);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter new_height for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_new_width(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"images");
      if (bVar1) {
        pIVar15 = V1LayerParameter::mutable_image_data_param(layer_param);
        uVar4 = V0LayerParameter::new_width(this);
        ImageDataParameter::set_new_width(pIVar15,uVar4);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter new_width for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_concat_dim(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"concat");
      if (bVar1) {
        this_03 = V1LayerParameter::mutable_concat_param(layer_param);
        uVar4 = V0LayerParameter::concat_dim(this);
        ConcatParameter::set_concat_dim(this_03,uVar4);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter concat_dim for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_det_fg_threshold(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"window_data");
      if (bVar1) {
        pWVar16 = V1LayerParameter::mutable_window_data_param(layer_param);
        fVar19 = V0LayerParameter::det_fg_threshold(this);
        WindowDataParameter::set_fg_threshold(pWVar16,fVar19);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter det_fg_threshold for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_det_bg_threshold(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"window_data");
      if (bVar1) {
        pWVar16 = V1LayerParameter::mutable_window_data_param(layer_param);
        fVar19 = V0LayerParameter::det_bg_threshold(this);
        WindowDataParameter::set_bg_threshold(pWVar16,fVar19);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter det_bg_threshold for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_det_fg_fraction(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"window_data");
      if (bVar1) {
        pWVar16 = V1LayerParameter::mutable_window_data_param(layer_param);
        fVar19 = V0LayerParameter::det_fg_fraction(this);
        WindowDataParameter::set_fg_fraction(pWVar16,fVar19);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter det_fg_fraction for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_det_context_pad(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"window_data");
      if (bVar1) {
        pWVar16 = V1LayerParameter::mutable_window_data_param(layer_param);
        uVar4 = V0LayerParameter::det_context_pad(this);
        WindowDataParameter::set_context_pad(pWVar16,uVar4);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter det_context_pad for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_det_crop_mode(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"window_data");
      if (bVar1) {
        pWVar16 = V1LayerParameter::mutable_window_data_param(layer_param);
        psVar17 = V0LayerParameter::det_crop_mode_abi_cxx11_(this);
        WindowDataParameter::set_crop_mode(pWVar16,psVar17);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter det_crop_mode for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
    bVar1 = V0LayerParameter::has_hdf5_output_param(this);
    if (bVar1) {
      bVar1 = std::operator==(psVar5,"hdf5_output");
      if (bVar1) {
        this_04 = V1LayerParameter::mutable_hdf5_output_param(layer_param);
        from_00 = V0LayerParameter::hdf5_output_param(this);
        HDF5OutputParameter::CopyFrom(this_04,from_00);
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter hdf5_output_param for layer type ");
        std::operator<<(poVar18,(string *)psVar5);
        i_1._3_1_ = false;
      }
    }
  }
  return i_1._3_1_;
}

Assistant:

bool UpgradeV0LayerParameter(const V1LayerParameter& v0_layer_connection,
                             V1LayerParameter* layer_param) {
  bool is_fully_compatible = true;
  layer_param->Clear();
  for (int i = 0; i < v0_layer_connection.bottom_size(); ++i) {
    layer_param->add_bottom(v0_layer_connection.bottom(i));
  }
  for (int i = 0; i < v0_layer_connection.top_size(); ++i) {
    layer_param->add_top(v0_layer_connection.top(i));
  }
  if (v0_layer_connection.has_layer()) {
    const V0LayerParameter& v0_layer_param = v0_layer_connection.layer();
    if (v0_layer_param.has_name()) {
      layer_param->set_name(v0_layer_param.name());
    }
    const string& type = v0_layer_param.type();
    if (v0_layer_param.has_type()) {
      layer_param->set_type(UpgradeV0LayerType(type));
    }
    for (int i = 0; i < v0_layer_param.blobs_size(); ++i) {
      layer_param->add_blobs()->CopyFrom(v0_layer_param.blobs(i));
    }
    for (int i = 0; i < v0_layer_param.blobs_lr_size(); ++i) {
      layer_param->add_blobs_lr(v0_layer_param.blobs_lr(i));
    }
    for (int i = 0; i < v0_layer_param.weight_decay_size(); ++i) {
      layer_param->add_weight_decay(v0_layer_param.weight_decay(i));
    }
    if (v0_layer_param.has_num_output()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->set_num_output(
            v0_layer_param.num_output());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->set_num_output(
            v0_layer_param.num_output());
      } else {
        LOG(ERROR) << "Unknown parameter num_output for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_biasterm()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->set_bias_term(
            v0_layer_param.biasterm());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->set_bias_term(
            v0_layer_param.biasterm());
      } else {
        LOG(ERROR) << "Unknown parameter biasterm for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_weight_filler()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->
            mutable_weight_filler()->CopyFrom(v0_layer_param.weight_filler());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->
            mutable_weight_filler()->CopyFrom(v0_layer_param.weight_filler());
      } else {
        LOG(ERROR) << "Unknown parameter weight_filler for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_bias_filler()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->
            mutable_bias_filler()->CopyFrom(v0_layer_param.bias_filler());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->
            mutable_bias_filler()->CopyFrom(v0_layer_param.bias_filler());
      } else {
        LOG(ERROR) << "Unknown parameter bias_filler for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_pad()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->add_pad(v0_layer_param.pad());
      } else if (type == "pool") {
        layer_param->mutable_pooling_param()->set_pad(v0_layer_param.pad());
      } else {
        LOG(ERROR) << "Unknown parameter pad for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_kernelsize()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->add_kernel_size(
            v0_layer_param.kernelsize());
      } else if (type == "pool") {
        layer_param->mutable_pooling_param()->set_kernel_size(
            v0_layer_param.kernelsize());
      } else {
        LOG(ERROR) << "Unknown parameter kernelsize for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_group()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->set_group(
            v0_layer_param.group());
      } else {
        LOG(ERROR) << "Unknown parameter group for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_stride()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->add_stride(
            v0_layer_param.stride());
      } else if (type == "pool") {
        layer_param->mutable_pooling_param()->set_stride(
            v0_layer_param.stride());
      } else {
        LOG(ERROR) << "Unknown parameter stride for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_pool()) {
      if (type == "pool") {
        V0LayerParameter_PoolMethod pool = v0_layer_param.pool();
        switch (pool) {
        case V0LayerParameter_PoolMethod_MAX:
          layer_param->mutable_pooling_param()->set_pool(
              PoolingParameter_PoolMethod_MAX);
          break;
        case V0LayerParameter_PoolMethod_AVE:
          layer_param->mutable_pooling_param()->set_pool(
              PoolingParameter_PoolMethod_AVE);
          break;
        case V0LayerParameter_PoolMethod_STOCHASTIC:
          layer_param->mutable_pooling_param()->set_pool(
              PoolingParameter_PoolMethod_STOCHASTIC);
          break;
        default:
          LOG(ERROR) << "Unknown pool method " << pool;
          is_fully_compatible = false;
        }
      } else {
        LOG(ERROR) << "Unknown parameter pool for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_dropout_ratio()) {
      if (type == "dropout") {
        layer_param->mutable_dropout_param()->set_dropout_ratio(
            v0_layer_param.dropout_ratio());
      } else {
        LOG(ERROR) << "Unknown parameter dropout_ratio for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_local_size()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_local_size(
            v0_layer_param.local_size());
      } else {
        LOG(ERROR) << "Unknown parameter local_size for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_alpha()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_alpha(v0_layer_param.alpha());
      } else {
        LOG(ERROR) << "Unknown parameter alpha for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_beta()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_beta(v0_layer_param.beta());
      } else {
        LOG(ERROR) << "Unknown parameter beta for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_k()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_k(v0_layer_param.k());
      } else {
        LOG(ERROR) << "Unknown parameter k for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_source()) {
      if (type == "data") {
        layer_param->mutable_data_param()->set_source(v0_layer_param.source());
      } else if (type == "hdf5_data") {
        layer_param->mutable_hdf5_data_param()->set_source(
            v0_layer_param.source());
      } else if (type == "images") {
        layer_param->mutable_image_data_param()->set_source(
            v0_layer_param.source());
      } else if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_source(
            v0_layer_param.source());
      } else if (type == "infogain_loss") {
        layer_param->mutable_infogain_loss_param()->set_source(
            v0_layer_param.source());
      } else {
        LOG(ERROR) << "Unknown parameter source for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_scale()) {
      layer_param->mutable_transform_param()->
          set_scale(v0_layer_param.scale());
    }
    if (v0_layer_param.has_meanfile()) {
      layer_param->mutable_transform_param()->
          set_mean_file(v0_layer_param.meanfile());
    }
    if (v0_layer_param.has_batchsize()) {
      if (type == "data") {
        layer_param->mutable_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else if (type == "hdf5_data") {
        layer_param->mutable_hdf5_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else if (type == "images") {
        layer_param->mutable_image_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else {
        LOG(ERROR) << "Unknown parameter batchsize for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_cropsize()) {
      layer_param->mutable_transform_param()->
          set_crop_size(v0_layer_param.cropsize());
    }
    if (v0_layer_param.has_mirror()) {
      layer_param->mutable_transform_param()->
          set_mirror(v0_layer_param.mirror());
    }
    if (v0_layer_param.has_rand_skip()) {
      if (type == "data") {
        layer_param->mutable_data_param()->set_rand_skip(
            v0_layer_param.rand_skip());
      } else if (type == "images") {
        layer_param->mutable_image_data_param()->set_rand_skip(
            v0_layer_param.rand_skip());
      } else {
        LOG(ERROR) << "Unknown parameter rand_skip for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_shuffle_images()) {
      if (type == "images") {
        layer_param->mutable_image_data_param()->set_shuffle(
            v0_layer_param.shuffle_images());
      } else {
        LOG(ERROR) << "Unknown parameter shuffle for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_new_height()) {
      if (type == "images") {
        layer_param->mutable_image_data_param()->set_new_height(
            v0_layer_param.new_height());
      } else {
        LOG(ERROR) << "Unknown parameter new_height for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_new_width()) {
      if (type == "images") {
        layer_param->mutable_image_data_param()->set_new_width(
            v0_layer_param.new_width());
      } else {
        LOG(ERROR) << "Unknown parameter new_width for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_concat_dim()) {
      if (type == "concat") {
        layer_param->mutable_concat_param()->set_concat_dim(
            v0_layer_param.concat_dim());
      } else {
        LOG(ERROR) << "Unknown parameter concat_dim for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_fg_threshold()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_fg_threshold(
            v0_layer_param.det_fg_threshold());
      } else {
        LOG(ERROR) << "Unknown parameter det_fg_threshold for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_bg_threshold()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_bg_threshold(
            v0_layer_param.det_bg_threshold());
      } else {
        LOG(ERROR) << "Unknown parameter det_bg_threshold for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_fg_fraction()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_fg_fraction(
            v0_layer_param.det_fg_fraction());
      } else {
        LOG(ERROR) << "Unknown parameter det_fg_fraction for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_context_pad()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_context_pad(
            v0_layer_param.det_context_pad());
      } else {
        LOG(ERROR) << "Unknown parameter det_context_pad for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_crop_mode()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_crop_mode(
            v0_layer_param.det_crop_mode());
      } else {
        LOG(ERROR) << "Unknown parameter det_crop_mode for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_hdf5_output_param()) {
      if (type == "hdf5_output") {
        layer_param->mutable_hdf5_output_param()->CopyFrom(
            v0_layer_param.hdf5_output_param());
      } else {
        LOG(ERROR) << "Unknown parameter hdf5_output_param for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
  }
  return is_fully_compatible;
}